

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O3

string * __thiscall
viennamath::rt_latex_unary_expr_processor<viennamath::rt_expression_interface<double>>::
process_abi_cxx11_(string *__return_storage_ptr__,void *this,rt_expression_interface<double> *ptr,
                  bool use_parenthesis,
                  rt_latex_translator<viennamath::rt_expression_interface<double>_> *translator)

{
  UnaryExpr *e;
  
  if ((ptr != (rt_expression_interface<double> *)0x0) &&
     (e = (UnaryExpr *)
          __dynamic_cast(ptr,&rt_expression_interface<double>::typeinfo,
                         &rt_unary_expr<viennamath::rt_expression_interface<double>>::typeinfo,0),
     e != (UnaryExpr *)0x0)) {
    process_impl_abi_cxx11_(__return_storage_ptr__,this,e,use_parenthesis,translator);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string process(InterfaceType const * ptr, bool use_parenthesis, rt_latex_translator<InterfaceType> const & translator) const
      {
        if (dynamic_cast< const UnaryExpr * >(ptr) != NULL)
        {
          const UnaryExpr * temp = dynamic_cast< const UnaryExpr * >(ptr);
          return process_impl(*temp, use_parenthesis, translator);
        }

        return "";
      }